

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext *ctx,ExprZeroInitialize *node)

{
  TypeBase *pTVar1;
  LLVMValueRef pLVar2;
  
  pTVar1 = node->address->type;
  if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x12)) {
    CompileLlvm(ctx,node->address);
    CompileLlvmType(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
    pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
    return pLVar2;
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x61f,
                "LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &, ExprZeroInitialize *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmZeroInitialize(LlvmCompilationContext &ctx, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	LLVMValueRef address = CompileLlvm(ctx, node->address);

	LLVMBuildStore(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, refType->subType)), address);

	return CheckType(ctx, node, NULL);
}